

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseOutgoing.cpp
# Opt level: O1

bool __thiscall
tonk::OutgoingQueue::Append
          (OutgoingQueue *this,uint messageType,uint8_t *messageData,uint messageBytes)

{
  uint uVar1;
  uint uVar2;
  OutgoingQueuedDatagram *pOVar3;
  bool bVar4;
  uint uVar5;
  
  pOVar3 = this->OutBuffer;
  if (pOVar3 == (OutgoingQueuedDatagram *)0x0) {
    bVar4 = false;
  }
  else {
    uVar2 = pOVar3->NextWriteOffset;
    uVar5 = uVar2 + 2 + messageBytes;
    uVar1 = this->Common->MaxMessageSectionBytes;
    bVar4 = uVar5 <= uVar1;
    if (uVar5 <= uVar1) {
      *(ushort *)(pOVar3->Data + (ulong)uVar2 + 2 + -2) =
           (ushort)(messageType << 0xb) | (ushort)messageBytes;
      memcpy(pOVar3->Data + (ulong)uVar2 + 2,messageData,(ulong)messageBytes);
      pOVar3->NextWriteOffset = uVar5;
      this->QueuedBytes = this->QueuedBytes + messageBytes + 2;
      bVar4 = true;
    }
  }
  return bVar4;
}

Assistant:

bool OutgoingQueue::Append(
    unsigned messageType,
    const uint8_t* messageData,
    unsigned messageBytes)
{
    TONK_VERBOSE_OUTGOING_LOG("OutgoingQueue::Append messageType=", messageType,
        " messageBytes=", messageBytes, " OutBuffer=", OutBuffer);

    OutgoingQueuedDatagram* datagram = OutBuffer;
    if (!datagram)
    {
        TONK_VERBOSE_OUTGOING_LOG("Append: OutBuffer is null - abort");
        return false;
    }

    const unsigned writeBytes = static_cast<unsigned>(
        protocol::kMessageFrameBytes + messageBytes);
    const unsigned nextWriteOffset = datagram->NextWriteOffset;

    if (nextWriteOffset + writeBytes > Common->MaxMessageSectionBytes)
    {
        TONK_VERBOSE_OUTGOING_LOG("Append: nextWriteOffset=", nextWriteOffset,
            " + writeBytes=", writeBytes, " > ", Common->MaxMessageSectionBytes);
        return false;
    }

    uint8_t* messagePtr = datagram->Data + nextWriteOffset;

    // Write 2-byte message frame header
    protocol::WriteMessageFrameHeader(messagePtr, messageType, messageBytes);

    // Copy message into place
    memcpy(messagePtr + protocol::kMessageFrameBytes, messageData, messageBytes);

    // Record that the data was written
    datagram->NextWriteOffset = nextWriteOffset + writeBytes;

    // Update queued bytes
    QueuedBytes += writeBytes;

    TONK_VERBOSE_OUTGOING_LOG("Append: WROTE TO DATAGRAM datagram->NextWriteOffset=",
        datagram->NextWriteOffset, " + writeBytes=", writeBytes, " MaxMessageSectionBytes=",
        Common->MaxMessageSectionBytes, " QueuedBytes=", QueuedBytes);

#ifdef TONK_DETAILED_STATS
    datagram->AddMessageStats(messageType, messageBytes);
#endif // TONK_DETAILED_STATS

    return true;
}